

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O0

string * compareObjects(string *__return_storage_ptr__,string *label,QPDFObjectHandle *act,
                       QPDFObjectHandle *exp)

{
  uchar *__s1;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  string *psVar6;
  long lVar7;
  long lVar8;
  void *__s2;
  size_t __n;
  allocator<char> local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  void *local_2a0;
  uchar *exp_buf;
  uchar *act_buf;
  shared_ptr<Buffer> local_280;
  shared_ptr<Buffer> local_270;
  shared_ptr<Buffer> local_260;
  undefined1 local_250 [8];
  shared_ptr<Buffer> exp_data;
  shared_ptr<Buffer> act_data;
  string local_228 [32];
  string *local_208;
  T *filter;
  iterator __end3;
  iterator __begin3;
  QPDFArrayItems *__range3;
  byte local_182;
  allocator<char> local_181;
  string local_180 [6];
  bool uncompress;
  undefined1 local_160 [8];
  QPDFObjectHandle act_filters;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  QPDFObjectHandle local_100;
  int local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [48];
  undefined1 local_48 [8];
  QPDFObjectHandle exp_dict;
  QPDFObjectHandle act_dict;
  QPDFObjectHandle *exp_local;
  QPDFObjectHandle *act_local;
  string *label_local;
  
  iVar3 = QPDFObjectHandle::getTypeCode();
  iVar4 = QPDFObjectHandle::getTypeCode();
  if (iVar3 == iVar4) {
    uVar5 = QPDFObjectHandle::isStream();
    if ((uVar5 & 1) == 0) {
      QPDFObjectHandle::unparseResolved_abi_cxx11_();
      QPDFObjectHandle::unparseResolved_abi_cxx11_();
      bVar2 = std::operator!=(&local_2c0,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2c0);
      if (bVar2) {
        QTC::TC("compare","different non-stream",0);
        std::operator+(__return_storage_ptr__,label,": object contents differ");
        return __return_storage_ptr__;
      }
    }
    else {
      QPDFObjectHandle::getDict();
      QPDFObjectHandle::getDict();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_78,"/Length",&local_79);
      QPDFObjectHandle::removeKey
                ((string *)
                 &exp_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator(&local_79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a0,"/Length",&local_a1);
      QPDFObjectHandle::removeKey((string *)local_48);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
      QPDFObjectHandle::unparse_abi_cxx11_();
      QPDFObjectHandle::unparse_abi_cxx11_();
      bVar2 = std::operator!=(&local_c8,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      if (bVar2) {
        QTC::TC("compare","different stream dictionaries",0);
        std::operator+(__return_storage_ptr__,label,": stream dictionaries differ");
        local_ec = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_120,"/Type",&local_121);
        QPDFObjectHandle::getKey((string *)&local_100);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_148,"/XRef",
                   (allocator<char> *)
                   ((long)&act_filters.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        bVar1 = QPDFObjectHandle::isNameAndEquals((string *)&local_100);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&act_filters.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::~QPDFObjectHandle(&local_100);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator(&local_121);
        if ((bVar1 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_180,"/Filter",&local_181);
          QPDFObjectHandle::getKey((string *)local_160);
          std::__cxx11::string::~string(local_180);
          std::allocator<char>::~allocator(&local_181);
          local_182 = 0;
          bVar1 = QPDFObjectHandle::isName();
          if ((bVar1 & 1) != 0) {
            QPDFObjectHandle::wrapInArray();
            QPDFObjectHandle::operator=((QPDFObjectHandle *)local_160,(QPDFObjectHandle *)&__range3)
            ;
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range3);
          }
          bVar1 = QPDFObjectHandle::isArray();
          if ((bVar1 & 1) != 0) {
            QPDFObjectHandle::aitems();
            QPDFObjectHandle::QPDFArrayItems::begin();
            QPDFObjectHandle::QPDFArrayItems::end();
            while (bVar2 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                                     ((iterator *)
                                      &__end3.ivalue.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount,(iterator *)&filter), bVar2) {
              psVar6 = (string *)
                       QPDFObjectHandle::QPDFArrayItems::iterator::operator*
                                 ((iterator *)
                                  &__end3.ivalue.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
              local_208 = psVar6;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (local_228,"/FlateDecode",
                         (allocator<char> *)
                         ((long)&act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              bVar1 = QPDFObjectHandle::isNameAndEquals(psVar6);
              std::__cxx11::string::~string(local_228);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              if ((bVar1 & 1) != 0) {
                local_182 = 1;
                break;
              }
              QPDFObjectHandle::QPDFArrayItems::iterator::operator++
                        ((iterator *)
                         &__end3.ivalue.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            }
            local_ec = 2;
            QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&filter);
            QPDFObjectHandle::QPDFArrayItems::iterator::~iterator
                      ((iterator *)
                       &__end3.ivalue.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            QPDFObjectHandle::QPDFArrayItems::~QPDFArrayItems
                      ((QPDFArrayItems *)
                       &__begin3.ivalue.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          std::shared_ptr<Buffer>::shared_ptr
                    ((shared_ptr<Buffer> *)
                     &exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)local_250);
          if ((local_182 & 1) == 0) {
            QTC::TC("compare","not uncompressing",0);
            QPDFObjectHandle::getRawStreamData();
            std::shared_ptr<Buffer>::operator=
                      ((shared_ptr<Buffer> *)
                       &exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       &local_280);
            std::shared_ptr<Buffer>::~shared_ptr(&local_280);
            QPDFObjectHandle::getRawStreamData();
            std::shared_ptr<Buffer>::operator=
                      ((shared_ptr<Buffer> *)local_250,(shared_ptr<Buffer> *)&act_buf);
            std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&act_buf);
          }
          else {
            QTC::TC("compare","uncompressing",0);
            QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_260);
            std::shared_ptr<Buffer>::operator=
                      ((shared_ptr<Buffer> *)
                       &exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       &local_260);
            std::shared_ptr<Buffer>::~shared_ptr(&local_260);
            QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_270);
            std::shared_ptr<Buffer>::operator=((shared_ptr<Buffer> *)local_250,&local_270);
            std::shared_ptr<Buffer>::~shared_ptr(&local_270);
          }
          std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          lVar7 = Buffer::getSize();
          std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_250);
          lVar8 = Buffer::getSize();
          if (lVar7 == lVar8) {
            std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            ;
            exp_buf = (uchar *)Buffer::getBuffer();
            std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_250);
            __s2 = (void *)Buffer::getBuffer();
            __s1 = exp_buf;
            local_2a0 = __s2;
            std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            ;
            __n = Buffer::getSize();
            iVar3 = memcmp(__s1,__s2,__n);
            if (iVar3 == 0) {
              local_ec = 0;
            }
            else {
              QTC::TC("compare","different data",(byte)~local_182 & 1);
              std::operator+(__return_storage_ptr__,label,": stream data differs");
              local_ec = 1;
            }
          }
          else {
            QTC::TC("compare","differing data size",(byte)~local_182 & 1);
            std::operator+(__return_storage_ptr__,label,": stream data size differs");
            local_ec = 1;
          }
          std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_250);
          std::shared_ptr<Buffer>::~shared_ptr
                    ((shared_ptr<Buffer> *)
                     &exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_160);
        }
        else {
          QTC::TC("compare","ignore data for xref stream",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",
                     (allocator<char> *)
                     ((long)&act_filters.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 6));
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&act_filters.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 6));
          local_ec = 1;
        }
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &exp_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (local_ec != 0) {
        return __return_storage_ptr__;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2e1);
    std::allocator<char>::~allocator(&local_2e1);
  }
  else {
    QTC::TC("compare","objects with different type",0);
    std::operator+(__return_storage_ptr__,label,": different types");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
compareObjects(std::string const& label, QPDFObjectHandle act, QPDFObjectHandle exp)
{
    if (act.getTypeCode() != exp.getTypeCode()) {
        QTC::TC("compare", "objects with different type");
        return label + ": different types";
    }
    if (act.isStream()) {
        // Disregard stream lengths. The length of stream data is compared later, and we don't care
        // about the length of compressed data as long as the uncompressed data matches.
        auto act_dict = act.getDict();
        auto exp_dict = exp.getDict();
        act_dict.removeKey("/Length");
        exp_dict.removeKey("/Length");
        if (act_dict.unparse() != exp_dict.unparse()) {
            QTC::TC("compare", "different stream dictionaries");
            return label + ": stream dictionaries differ";
        }
        if (act_dict.getKey("/Type").isNameAndEquals("/XRef")) {
            // Cross-reference streams will generally not match, but we have numerous tests that
            // meaningfully ensure that xref streams are correct.
            QTC::TC("compare", "ignore data for xref stream");
            return "";
        }
        auto act_filters = act_dict.getKey("/Filter");
        bool uncompress = false;
        if (act_filters.isName()) {
            act_filters = act_filters.wrapInArray();
        }
        if (act_filters.isArray()) {
            for (auto& filter: act_filters.aitems()) {
                if (filter.isNameAndEquals("/FlateDecode")) {
                    uncompress = true;
                    break;
                }
            }
        }
        std::shared_ptr<Buffer> act_data;
        std::shared_ptr<Buffer> exp_data;
        if (uncompress) {
            QTC::TC("compare", "uncompressing");
            act_data = act.getStreamData();
            exp_data = exp.getStreamData();
        } else {
            QTC::TC("compare", "not uncompressing");
            act_data = act.getRawStreamData();
            exp_data = exp.getRawStreamData();
        }
        if (act_data->getSize() != exp_data->getSize()) {
            QTC::TC("compare", "differing data size", uncompress ? 0 : 1);
            return label + ": stream data size differs";
        }
        auto act_buf = act_data->getBuffer();
        auto exp_buf = exp_data->getBuffer();
        if (memcmp(act_buf, exp_buf, act_data->getSize()) != 0) {
            QTC::TC("compare", "different data", uncompress ? 0 : 1);
            return label + ": stream data differs";
        }
    } else if (act.unparseResolved() != exp.unparseResolved()) {
        QTC::TC("compare", "different non-stream");
        return label + ": object contents differ";
    }
    return "";
}